

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O2

void so_5::disp::one_thread::impl::data_source_details::track_activity
               (mbox_t *mbox,
               common_data_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
               *data)

{
  id local_68;
  suffix_t local_60;
  work_thread_activity_stats_t local_58;
  
  local_60 = stats::suffixes::work_thread_activity();
  local_68._M_thread =
       (data->m_work_thread->super_activity_tracking_impl_t).
       super_common_data_t<so_5::disp::reuse::work_thread::demand_queue_details::queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::with_activity_tracking_impl_t>_>
       .m_thread_id._M_thread;
  reuse::work_thread::details::activity_tracking_impl_t::take_activity_stats
            (&local_58,&data->m_work_thread->super_activity_tracking_impl_t);
  so_5::impl::instantiator_and_sender_base<so_5::stats::messages::work_thread_activity,false>::
  send<so_5::stats::prefix_t_const&,so_5::stats::suffix_t,std::thread::id,so_5::stats::work_thread_activity_stats_t>
            (mbox,&data->m_base_prefix,&local_60,&local_68,&local_58);
  return;
}

Assistant:

inline void
track_activity(
	const mbox_t & mbox,
	const common_data_t< work_thread::work_thread_with_activity_tracking_t > & data )
	{
		so_5::send< stats::messages::work_thread_activity >(
				mbox,
				data.m_base_prefix,
				stats::suffixes::work_thread_activity(),
				data.m_work_thread.thread_id(),
				data.m_work_thread.take_activity_stats() );
	}